

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcppLibrary.hpp
# Opt level: O0

string * tcpp::ExtractMultiLineComments
                   (string *__return_storage_ptr__,string *currInput,
                   function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                   *requestNextLineFunctor)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  string restStr;
  size_type pos;
  string *local_90;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_88;
  undefined1 local_68 [8];
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  enterCommentBlock;
  string local_40 [8];
  string input;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *requestNextLineFunctor_local;
  string *currInput_local;
  string *commentStr;
  
  input.field_2._8_8_ = requestNextLineFunctor;
  std::__cxx11::string::string(local_40,(string *)currInput);
  enterCommentBlock._M_invoker._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pos = (size_type)local_68;
  local_90 = __return_storage_ptr__;
  Catch::clara::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  function(&local_88,
           (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
            *)input.field_2._8_8_);
  std::function<std::__cxx11::string(std::__cxx11::string&)>::
  function<tcpp::ExtractMultiLineComments(std::__cxx11::string&,std::function<std::__cxx11::string()>const&)::__0,void>
            ((function<std::__cxx11::string(std::__cxx11::string&)> *)local_68,
             (anon_class_48_3_0e3bdfda *)&pos);
  ExtractMultiLineComments(std::__cxx11::string&,std::function<std::__cxx11::string()>const&)::$_0::
  ~__0((__0 *)&pos);
  restStr.field_2._8_8_ = std::__cxx11::string::find((char *)local_40,0x2363b4);
  if (restStr.field_2._8_8_ == -1) {
    enterCommentBlock._M_invoker._7_1_ = 1;
  }
  else {
    std::__cxx11::string::substr((ulong)local_c0,(ulong)local_40);
    Catch::clara::std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(&local_e0,
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::operator+(&local_100,__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
    std::__cxx11::string::operator=((string *)currInput,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    enterCommentBlock._M_invoker._7_1_ = 1;
    std::__cxx11::string::~string((string *)local_c0);
  }
  Catch::clara::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)local_68);
  if ((enterCommentBlock._M_invoker._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

static std::string ExtractMultiLineComments(std::string& currInput, const std::function<std::string()>& requestNextLineFunctor) TCPP_NOEXCEPT
	{
		std::string input = currInput;
		std::string commentStr;

		// \note here below all states of DFA are placed
		std::function<std::string(std::string&)> enterCommentBlock = [&enterCommentBlock, &commentStr, requestNextLineFunctor](std::string& input)
		{
			commentStr.append(input.substr(0, 2));
			input.erase(0, 2); // \note remove /*

			while (input.rfind("*/", 0) != 0 && !input.empty())
			{
				commentStr.push_back(input.front());
				input.erase(0, 1);

				if (input.rfind("//", 0) == 0)
				{
					commentStr.append(input.substr(0, 2));
					input.erase(0, 2);
				}

				if (input.rfind("/*", 0) == 0)
				{
					input = enterCommentBlock(input);
				}

				if (input.empty() && requestNextLineFunctor)
				{
					input = requestNextLineFunctor();
				}
			}

			commentStr.append(input.substr(0, 2));
			input.erase(0, 2); // \note remove */

			return input;
		};

		std::string::size_type pos = input.find("/*");
		if (pos != std::string::npos)
		{
			std::string restStr = input.substr(pos, std::string::npos);
			enterCommentBlock(restStr);

			currInput = commentStr + restStr;
			
			return commentStr;
		}

		return commentStr;
	}